

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_31::WebSocketImpl::sendImpl
          (WebSocketImpl *this,byte opcode,ArrayPtr<const_unsigned_char> message)

{
  ArrayPtr<const_unsigned_char> content;
  byte opcode_00;
  bool bVar1;
  Type *func;
  size_t payloadLen;
  AsyncIoStream *pAVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  undefined7 in_register_00000031;
  long lVar4;
  uchar *in_R8;
  ArrayPtr<unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> AVar5;
  Promise<void> PVar6;
  bool local_169;
  long local_148;
  Promise<void> local_140;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120 [8];
  Promise<void> promise;
  Array<unsigned_char> local_c0;
  undefined1 local_a8 [8];
  Array<unsigned_char> ownMessage;
  Mask local_85;
  Mask mask;
  long lStack_80;
  Promise<void> *p;
  Fault f_1;
  Fault local_38;
  Fault f;
  byte opcode_local;
  WebSocketImpl *this_local;
  ArrayPtr<const_unsigned_char> message_local;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2415:30),_void>
  *promise_1;
  
  lVar4 = CONCAT71(in_register_00000031,opcode);
  this_local = (WebSocketImpl *)message.size_;
  f.exception._7_1_ = (byte)message.ptr;
  message_local.size_ = (size_t)this;
  if (((*(byte *)(lVar4 + 0x21) ^ 0xff) & 1) == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x968,FAILED,"!disconnected","\"WebSocket can\'t send after disconnect()\"",
               (char (*) [40])"WebSocket can\'t send after disconnect()");
    _::Debug::Fault::fatal(&local_38);
  }
  if (((*(byte *)(lVar4 + 0x22) ^ 0xff) & 1) != 0) {
    *(undefined1 *)(lVar4 + 0x22) = 1;
    message_local.ptr = in_R8;
    func = (Type *)_::readMaybe<kj::Promise<void>>((Maybe<kj::Promise<void>_> *)(lVar4 + 0x78));
    if (func == (Type *)0x0) {
      local_169 = (*(byte *)(lVar4 + 0x20) & 1) != 0 || f.exception._7_1_ == '\b';
      *(bool *)(lVar4 + 0x20) = local_169;
      Maybe<kj::EntropySource_&>::Maybe<kj::EntropySource>
                ((Maybe<kj::EntropySource_&> *)&ownMessage.disposer,
                 (Maybe<kj::EntropySource_&> *)(lVar4 + 0x18));
      Mask::Mask(&local_85,(Maybe<kj::EntropySource_&>)ownMessage.disposer);
      Array<unsigned_char>::Array((Array<unsigned_char> *)local_a8);
      bVar1 = Mask::isZero(&local_85);
      AVar5.size_ = (size_t)message_local.ptr;
      AVar5.ptr = (uchar *)this_local;
      if (!bVar1) {
        content.size_ = (size_t)message_local.ptr;
        content.ptr = (uchar *)this_local;
        heapArray<unsigned_char>(&local_c0,content);
        Array<unsigned_char>::operator=((Array<unsigned_char> *)local_a8,&local_c0);
        Array<unsigned_char>::~Array(&local_c0);
        bytes = kj::Array::operator_cast_to_ArrayPtr((Array *)local_a8);
        Mask::apply(&local_85,bytes);
        AVar5 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_a8);
      }
      opcode_00 = f.exception._7_1_;
      message_local.ptr = (uchar *)AVar5.size_;
      this_local = (WebSocketImpl *)AVar5.ptr;
      payloadLen = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local)
      ;
      promise.super_PromiseBase.node.ptr._4_1_ = local_85.maskBytes[0];
      promise.super_PromiseBase.node.ptr._5_1_ = local_85.maskBytes[1];
      promise.super_PromiseBase.node.ptr._6_1_ = local_85.maskBytes[2];
      promise.super_PromiseBase.node.ptr._7_1_ = local_85.maskBytes[3];
      AVar5 = Header::compose((Header *)(lVar4 + 0x23),true,opcode_00,payloadLen,local_85);
      *(ArrayPtr<const_unsigned_char> *)(lVar4 + 0x38) = AVar5;
      *(WebSocketImpl **)(lVar4 + 0x48) = this_local;
      *(uchar **)(lVar4 + 0x50) = message_local.ptr;
      pAVar2 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)(lVar4 + 8));
      ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>::ArrayPtr<2ul>
                ((ArrayPtr<kj::ArrayPtr<unsigned_char_const>const> *)&local_130,
                 (ArrayPtr<const_unsigned_char> (*) [2])(lVar4 + 0x38));
      (*(pAVar2->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
                (local_120,&pAVar2->super_AsyncOutputStream,local_130,local_128);
      bVar1 = Mask::isZero(&local_85);
      if (!bVar1) {
        mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_a8);
        Promise<void>::attach<kj::Array<unsigned_char>>
                  (&local_140,(Array<unsigned_char> *)local_120);
        Promise<void>::operator=((Promise<void> *)local_120,&local_140);
        Promise<void>::~Promise(&local_140);
      }
      local_148 = lVar4;
      Promise<void>::
      then<kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::_lambda()_2_,kj::_::PropagateException>
                ((Promise<void> *)this,(Type *)local_120,(PropagateException *)&local_148);
      Promise<void>::~Promise((Promise<void> *)local_120);
      Array<unsigned_char>::~Array((Array<unsigned_char> *)local_a8);
      pPVar3 = extraout_RDX_00;
    }
    else {
      lStack_80 = lVar4;
      Promise<void>::
      then<kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::_lambda()_1_,kj::_::PropagateException>
                ((Promise<void> *)this,func,(PropagateException *)&stack0xffffffffffffff80);
      Maybe<kj::Promise<void>_>::operator=((Maybe<kj::Promise<void>_> *)(lVar4 + 0x78),(void *)0x0);
      pPVar3 = extraout_RDX;
    }
    PVar6.super_PromiseBase.node.ptr = pPVar3;
    PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar6.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
            ((Fault *)&p,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x969,FAILED,"!currentlySending","\"another message send is already in progress\"",
             (char (*) [44])"another message send is already in progress");
  _::Debug::Fault::fatal((Fault *)&p);
}

Assistant:

kj::Promise<void> sendImpl(byte opcode, kj::ArrayPtr<const byte> message) {
    KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
    KJ_REQUIRE(!currentlySending, "another message send is already in progress");

    currentlySending = true;

    KJ_IF_MAYBE(p, sendingPong) {
      // We recently sent a pong, make sure it's finished before proceeding.
      auto promise = p->then([this, opcode, message]() {
        currentlySending = false;
        return sendImpl(opcode, message);
      });
      sendingPong = nullptr;
      return promise;
    }

    // We don't stop the application from sending further messages after close() -- this is the
    // application's error to make. But, we do want to make sure we don't send any PONGs after a
    // close, since that would be our error. So we stack whether we closed for that reason.
    hasSentClose = hasSentClose || opcode == OPCODE_CLOSE;

    Mask mask(maskKeyGenerator);

    kj::Array<byte> ownMessage;
    if (!mask.isZero()) {
      // Sadness, we have to make a copy to apply the mask.
      ownMessage = kj::heapArray(message);
      mask.apply(ownMessage);
      message = ownMessage;
    }

    sendParts[0] = sendHeader.compose(true, opcode, message.size(), mask);
    sendParts[1] = message;

    auto promise = stream->write(sendParts);
    if (!mask.isZero()) {
      promise = promise.attach(kj::mv(ownMessage));
    }
    return promise.then([this]() {
      currentlySending = false;

      // Send queued pong if needed.
      KJ_IF_MAYBE(q, queuedPong) {
        kj::Array<byte> payload = kj::mv(*q);
        queuedPong = nullptr;
        queuePong(kj::mv(payload));
      }
    });
  }